

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btStridingMeshInterface.cpp
# Opt level: O2

void __thiscall
btStridingMeshInterface::calculateAabbBruteForce
          (btStridingMeshInterface *this,btVector3 *aabbMin,btVector3 *aabbMax)

{
  btInternalTriangleIndexCallback local_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  undefined4 local_20;
  undefined4 uStack_1c;
  undefined4 uStack_18;
  undefined4 uStack_14;
  
  local_38._vptr_btInternalTriangleIndexCallback =
       (_func_int **)&PTR__btInternalTriangleIndexCallback_001efb58;
  local_30 = 0x5d5e0b6b;
  uStack_2c = 0x5d5e0b6b;
  uStack_28 = 0x5d5e0b6b;
  uStack_24 = 0;
  local_20 = 0xdd5e0b6b;
  uStack_1c = 0xdd5e0b6b;
  uStack_18 = 0xdd5e0b6b;
  uStack_14 = 0;
  aabbMin->m_floats[0] = -1e+18;
  aabbMin->m_floats[1] = -1e+18;
  aabbMin->m_floats[2] = -1e+18;
  aabbMin->m_floats[3] = 0.0;
  aabbMax->m_floats[0] = 1e+18;
  aabbMax->m_floats[1] = 1e+18;
  aabbMax->m_floats[2] = 1e+18;
  aabbMax->m_floats[3] = 0.0;
  (*this->_vptr_btStridingMeshInterface[2])(this,&local_38,aabbMin,aabbMax);
  *(ulong *)aabbMin->m_floats = CONCAT44(uStack_2c,local_30);
  *(ulong *)(aabbMin->m_floats + 2) = CONCAT44(uStack_24,uStack_28);
  *(ulong *)aabbMax->m_floats = CONCAT44(uStack_1c,local_20);
  *(ulong *)(aabbMax->m_floats + 2) = CONCAT44(uStack_14,uStack_18);
  btInternalTriangleIndexCallback::~btInternalTriangleIndexCallback(&local_38);
  return;
}

Assistant:

void	btStridingMeshInterface::calculateAabbBruteForce(btVector3& aabbMin,btVector3& aabbMax)
{

	struct	AabbCalculationCallback : public btInternalTriangleIndexCallback
	{
		btVector3	m_aabbMin;
		btVector3	m_aabbMax;

		AabbCalculationCallback()
		{
			m_aabbMin.setValue(btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT));
			m_aabbMax.setValue(btScalar(-BT_LARGE_FLOAT),btScalar(-BT_LARGE_FLOAT),btScalar(-BT_LARGE_FLOAT));
		}

		virtual void internalProcessTriangleIndex(btVector3* triangle,int partId,int  triangleIndex)
		{
			(void)partId;
			(void)triangleIndex;

			m_aabbMin.setMin(triangle[0]);
			m_aabbMax.setMax(triangle[0]);
			m_aabbMin.setMin(triangle[1]);
			m_aabbMax.setMax(triangle[1]);
			m_aabbMin.setMin(triangle[2]);
			m_aabbMax.setMax(triangle[2]);
		}
	};

	//first calculate the total aabb for all triangles
	AabbCalculationCallback	aabbCallback;
	aabbMin.setValue(btScalar(-BT_LARGE_FLOAT),btScalar(-BT_LARGE_FLOAT),btScalar(-BT_LARGE_FLOAT));
	aabbMax.setValue(btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT));
	InternalProcessAllTriangles(&aabbCallback,aabbMin,aabbMax);

	aabbMin = aabbCallback.m_aabbMin;
	aabbMax = aabbCallback.m_aabbMax;
}